

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O1

void __thiscall gui::MenuBar::draw(MenuBar *this,RenderTarget *target,RenderStates states)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  element_type *peVar5;
  pointer pMVar6;
  long lVar7;
  pointer pMVar8;
  pointer pMVar9;
  Vector2f *pVVar10;
  bool bVar11;
  uint uVar12;
  Transform *right;
  MenuList *menu;
  pointer pMVar13;
  Vector2f *position;
  long lVar14;
  Vector2f local_38;
  
  bVar11 = Widget::isVisible(&this->super_Widget);
  if (bVar11) {
    right = Widget::getTransform(&this->super_Widget);
    sf::operator*=(&states.transform,right);
    sf::RectangleShape::setSize
              (&((this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->bar_,&this->barSize_);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       bar_,&states);
    if (this->selectedMenu_ != -1) {
      peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      sf::Shape::setFillColor(&(peVar5->highlight_).super_Shape,&peVar5->highlightColor_);
      peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      sf::Transformable::setPosition
                (&(peVar5->highlight_).super_Shape.super_Transformable,
                 (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                 _M_impl.super__Vector_impl_data._M_start[this->selectedMenu_].labelPosition_.x -
                 (peVar5->barTextPadding_).x,0.0);
      peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      fVar1 = (peVar5->barTextPadding_).x;
      local_38.y = (this->barSize_).y;
      local_38.x = fVar1 + fVar1 +
                   (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                   _M_impl.super__Vector_impl_data._M_start[this->selectedMenu_].labelWidth_;
      sf::RectangleShape::setSize(&peVar5->highlight_,&local_38);
      sf::RenderTarget::draw
                (target,(Drawable *)
                        &((this->style_).
                          super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->highlight_,&states);
    }
    peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    sf::Text::setFillColor(&peVar5->text_,&peVar5->textColor_);
    pMVar6 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pMVar13 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                   _M_impl.super__Vector_impl_data._M_start; pMVar13 != pMVar6;
        pMVar13 = pMVar13 + 1) {
      sf::Text::setString(&((this->style_).
                            super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->text_,&pMVar13->name);
      sf::Transformable::setPosition
                (&(((this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->text_).super_Transformable,&pMVar13->labelPosition_);
      sf::RenderTarget::draw
                (target,&(((this->style_).
                           super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->text_).super_Drawable,&states);
    }
    if (this->menuIsOpen_ != false) {
      iVar4 = this->selectedMenu_;
      pMVar13 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sf::RectangleShape::setSize
                (&((this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->menu_,&pMVar13[iVar4].menuSize_);
      peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_38.y = (this->barSize_).y;
      local_38.x = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                   _M_impl.super__Vector_impl_data._M_start[this->selectedMenu_].labelPosition_.x -
                   (peVar5->barTextPadding_).x;
      sf::Transformable::setPosition(&(peVar5->menu_).super_Shape.super_Transformable,&local_38);
      sf::RenderTarget::draw
                (target,(Drawable *)
                        &((this->style_).
                          super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->menu_,&states);
      if ((long)pMVar13[iVar4].selectedItem_ != -1) {
        lVar7 = *(long *)&pMVar13[iVar4].items.
                          super__Vector_base<gui::MenuItem,_std::allocator<gui::MenuItem>_>._M_impl.
                          super__Vector_impl_data;
        lVar14 = (long)pMVar13[iVar4].selectedItem_ * 0x58;
        peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        sf::Shape::setFillColor
                  (&(peVar5->highlight_).super_Shape,
                   &peVar5->highlightColor_ + (*(byte *)(lVar7 + 0x40 + lVar14) ^ 1));
        peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        sf::Transformable::setPosition
                  (&(peVar5->highlight_).super_Shape.super_Transformable,
                   *(float *)(lVar7 + 0x44 + lVar14) - (peVar5->menuTextPadding_).x,
                   *(float *)(lVar7 + 0x48 + lVar14) - (peVar5->menuTextPadding_).y);
        peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        fVar1 = pMVar13[iVar4].menuSize_.x;
        fVar2 = (peVar5->menuTextPadding_).y;
        fVar3 = (peVar5->menuTextPadding_).z;
        uVar12 = sf::Text::getCharacterSize(&peVar5->text_);
        local_38.y = fVar2 + fVar2 + (float)uVar12 * fVar3;
        local_38.x = fVar1;
        sf::RectangleShape::setSize(&peVar5->highlight_,&local_38);
        sf::RenderTarget::draw
                  (target,(Drawable *)
                          &((this->style_).
                            super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->highlight_,&states);
      }
      pMVar8 = pMVar13[iVar4].items.
               super__Vector_base<gui::MenuItem,_std::allocator<gui::MenuItem>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar9 = *(pointer *)
                ((long)&pMVar13[iVar4].items.
                        super__Vector_base<gui::MenuItem,_std::allocator<gui::MenuItem>_>._M_impl +
                8);
      if (pMVar8 != pMVar9) {
        position = &pMVar8->rightPosition_;
        do {
          peVar5 = (this->style_).super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          sf::Text::setFillColor
                    (&peVar5->text_,&peVar5->textColor_ + (*(byte *)&position[-2].y ^ 1));
          sf::Text::setString(&((this->style_).
                                super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->text_,(String *)&position[-10].y);
          sf::Transformable::setPosition
                    (&(((this->style_).
                        super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      text_).super_Transformable,position + -1);
          sf::RenderTarget::draw
                    (target,&(((this->style_).
                               super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->text_).super_Drawable,&states);
          sf::Text::setString(&((this->style_).
                                super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->text_,(String *)&position[-6].y);
          sf::Transformable::setPosition
                    (&(((this->style_).
                        super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      text_).super_Transformable,position);
          sf::RenderTarget::draw
                    (target,&(((this->style_).
                               super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->text_).super_Drawable,&states);
          pVVar10 = position + 1;
          position = position + 0xb;
        } while ((pointer)&pVVar10->y != pMVar9);
      }
    }
  }
  return;
}

Assistant:

void MenuBar::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->bar_.setSize(barSize_);
    target.draw(style_->bar_, states);
    if (selectedMenu_ != -1) {
        style_->highlight_.setFillColor(style_->highlightColor_);
        style_->highlight_.setPosition(menus_[selectedMenu_].labelPosition_.x - style_->barTextPadding_.x, 0.0f);
        style_->highlight_.setSize({2.0f * style_->barTextPadding_.x + menus_[selectedMenu_].labelWidth_, barSize_.y});
        target.draw(style_->highlight_, states);
    }

    style_->text_.setFillColor(style_->textColor_);
    for (const auto& menu : menus_) {
        style_->text_.setString(menu.name);
        style_->text_.setPosition(menu.labelPosition_);
        target.draw(style_->text_, states);
    }

    if (menuIsOpen_) {
        const auto& menu = menus_[selectedMenu_];
        style_->menu_.setSize(menu.menuSize_);
        style_->menu_.setPosition(getOpenMenuPosition());
        target.draw(style_->menu_, states);

        if (menu.selectedItem_ != -1) {
            const auto& menuItem = menu.items[menu.selectedItem_];
            style_->highlight_.setFillColor(menuItem.enabled ? style_->highlightColor_ : style_->disabledHighlightColor_);
            style_->highlight_.setPosition(menuItem.leftPosition_.x - style_->menuTextPadding_.x, menuItem.leftPosition_.y - style_->menuTextPadding_.y);
            style_->highlight_.setSize({menu.menuSize_.x, 2.0f * style_->menuTextPadding_.y + style_->menuTextPadding_.z * style_->getCharacterSize()});
            target.draw(style_->highlight_, states);
        }

        for (const auto& menuItem : menu.items) {
            style_->text_.setFillColor(menuItem.enabled ? style_->textColor_ : style_->disabledTextColor_);
            style_->text_.setString(menuItem.leftText);
            style_->text_.setPosition(menuItem.leftPosition_);
            target.draw(style_->text_, states);
            style_->text_.setString(menuItem.rightText);
            style_->text_.setPosition(menuItem.rightPosition_);
            target.draw(style_->text_, states);
        }
    }
}